

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int ShouldCompress(uint8_t *input,size_t input_size,size_t num_literals)

{
  uint uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong local_4c8;
  size_t i;
  double max_total_bit_cost;
  uint32_t literal_histo [256];
  double corpus_size;
  size_t num_literals_local;
  size_t input_size_local;
  uint8_t *input_local;
  uint32_t *local_90;
  double retval;
  size_t sum;
  double *local_78;
  ulong local_70;
  size_t p;
  uint32_t *population_end;
  double retval_1;
  size_t sum_1;
  undefined8 local_48;
  double *local_40;
  ulong local_38;
  double local_30;
  ulong local_28;
  double local_20;
  double local_18;
  double local_10;
  undefined4 uVar11;
  undefined4 uVar12;
  
  auVar13._8_4_ = (int)(input_size >> 0x20);
  auVar13._0_8_ = input_size;
  auVar13._12_4_ = 0x45300000;
  literal_histo._1016_8_ =
       (auVar13._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)input_size) - 4503599627370496.0);
  auVar14._8_4_ = (int)(num_literals >> 0x20);
  auVar14._0_8_ = num_literals;
  auVar14._12_4_ = 0x45300000;
  if ((double)literal_histo._1016_8_ * 0.98 <=
      (auVar14._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)num_literals) - 4503599627370496.0)) {
    memset(&max_total_bit_cost,0,0x400);
    dVar2 = (double)literal_histo._1016_8_ * 8.0;
    for (local_4c8 = 0; local_4c8 < input_size; local_4c8 = local_4c8 + 0x2b) {
      literal_histo[(ulong)input[local_4c8] - 2] = literal_histo[(ulong)input[local_4c8] - 2] + 1;
    }
    local_78 = &max_total_bit_cost;
    sum = 0x100;
    local_48 = 0x100;
    sum_1 = (size_t)&retval;
    retval_1 = 0.0;
    population_end = (uint32_t *)0x0;
    p = (size_t)(literal_histo + 0xfe);
    local_40 = local_78;
    while (local_40 < p) {
      uVar1 = *(uint *)local_40;
      local_70 = CONCAT44(0,uVar1);
      retval_1 = (double)((long)retval_1 + local_70);
      auVar3._8_4_ = 0;
      auVar3._0_8_ = local_70;
      auVar3._12_4_ = 0x45300000;
      local_28 = local_70;
      if (local_70 < 0x100) {
        local_20 = kLog2Table[local_70];
        local_40 = (double *)((long)local_40 + 4);
      }
      else {
        auVar4._8_4_ = 0;
        auVar4._0_8_ = local_70;
        auVar4._12_4_ = 0x45300000;
        local_40 = (double *)((long)local_40 + 4);
        local_20 = log2((auVar4._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
      }
      population_end =
           (uint32_t *)
           (-((auVar3._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_20 +
           (double)population_end);
      uVar1 = *(uint *)local_40;
      local_70 = CONCAT44(0,uVar1);
      retval_1 = (double)((long)retval_1 + local_70);
      auVar5._8_4_ = 0;
      auVar5._0_8_ = local_70;
      auVar5._12_4_ = 0x45300000;
      local_38 = local_70;
      if (local_70 < 0x100) {
        local_30 = kLog2Table[local_70];
        local_40 = (double *)((long)local_40 + 4);
      }
      else {
        auVar6._8_4_ = 0;
        auVar6._0_8_ = local_70;
        auVar6._12_4_ = 0x45300000;
        local_40 = (double *)((long)local_40 + 4);
        local_30 = log2((auVar6._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
      }
      population_end =
           (uint32_t *)
           (-((auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_30 +
           (double)population_end);
    }
    if (retval_1 != 0.0) {
      uVar11 = (undefined4)((ulong)retval_1 >> 0x20);
      auVar7._8_4_ = uVar11;
      auVar7._0_8_ = retval_1;
      auVar7._12_4_ = 0x45300000;
      uVar12 = SUB84(retval_1,0);
      local_18 = retval_1;
      if ((ulong)retval_1 < 0x100) {
        local_10 = kLog2Table[(long)retval_1];
      }
      else {
        auVar8._8_4_ = uVar11;
        auVar8._0_8_ = retval_1;
        auVar8._12_4_ = 0x45300000;
        local_10 = log2((auVar8._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar12) - 4503599627370496.0));
      }
      population_end =
           (uint32_t *)
           (((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,uVar12) - 4503599627370496.0)) * local_10 +
           (double)population_end);
    }
    *(double *)sum_1 = retval_1;
    local_90 = population_end;
    uVar12 = (undefined4)((ulong)retval >> 0x20);
    auVar9._8_4_ = uVar12;
    auVar9._0_8_ = retval;
    auVar9._12_4_ = 0x45300000;
    if ((double)population_end <
        (auVar9._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,SUB84(retval,0)) - 4503599627370496.0)) {
      auVar10._8_4_ = uVar12;
      auVar10._0_8_ = retval;
      auVar10._12_4_ = 0x45300000;
      local_90 = (uint32_t *)
                 ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,SUB84(retval,0)) - 4503599627370496.0));
    }
    input_local._4_4_ = (uint)((double)local_90 < (dVar2 * 0.98) / 43.0);
  }
  else {
    input_local._4_4_ = 1;
  }
  return input_local._4_4_;
}

Assistant:

static BROTLI_BOOL ShouldCompress(
    const uint8_t* data, const size_t mask, const uint64_t last_flush_pos,
    const size_t bytes, const size_t num_literals, const size_t num_commands) {
  /* TODO: find more precise minimal block overhead. */
  if (bytes <= 2) return BROTLI_FALSE;
  if (num_commands < (bytes >> 8) + 2) {
    if ((double)num_literals > 0.99 * (double)bytes) {
      uint32_t literal_histo[256] = { 0 };
      static const uint32_t kSampleRate = 13;
      static const double kMinEntropy = 7.92;
      const double bit_cost_threshold =
          (double)bytes * kMinEntropy / kSampleRate;
      size_t t = (bytes + kSampleRate - 1) / kSampleRate;
      uint32_t pos = (uint32_t)last_flush_pos;
      size_t i;
      for (i = 0; i < t; i++) {
        ++literal_histo[data[pos & mask]];
        pos += kSampleRate;
      }
      if (BitsEntropy(literal_histo, 256) > bit_cost_threshold) {
        return BROTLI_FALSE;
      }
    }
  }
  return BROTLI_TRUE;
}